

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

XMLNode __thiscall XMLParser::XMLNode::deepCopy(XMLNode *this)

{
  char *pcVar1;
  XMLAttribute *pXVar2;
  int *piVar3;
  char **ppcVar4;
  XMLClear *pXVar5;
  XMLNode *pXVar6;
  int iVar7;
  long *in_RSI;
  XMLNode local_48 [3];
  int local_2c;
  XMLNodeData *pXStack_28;
  int n;
  XMLNodeData *p;
  XMLNode *this_local;
  XMLNode *x;
  
  this_local = this;
  if (*in_RSI == 0) {
    XMLNode(this,(XMLNode *)&emptyXMLNode);
  }
  else {
    p._7_1_ = 0;
    pcVar1 = stringDup(*(char **)*in_RSI,-1);
    XMLNode(this,(XMLNodeData *)0x0,pcVar1,*(char *)(*in_RSI + 0x18));
    pXStack_28 = this->d;
    local_2c = *(int *)(*in_RSI + 0x14);
    if (local_2c != 0) {
      pXStack_28->nAttribute = local_2c;
      pXVar2 = (XMLAttribute *)malloc((long)local_2c << 4);
      pXStack_28->pAttribute = pXVar2;
      while (iVar7 = local_2c + -1, local_2c != 0) {
        local_2c = iVar7;
        pcVar1 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + (long)iVar7 * 0x10),-1);
        pXStack_28->pAttribute[local_2c].lpszName = pcVar1;
        pcVar1 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + 8 + (long)local_2c * 0x10),-1);
        pXStack_28->pAttribute[local_2c].lpszValue = pcVar1;
      }
    }
    if (*(long *)(*in_RSI + 0x48) != 0) {
      local_2c = (*(int *)(*in_RSI + 8) + *(int *)(*in_RSI + 0xc) + *(int *)(*in_RSI + 0x10)) * 4;
      piVar3 = (int *)malloc((long)local_2c);
      pXStack_28->pOrder = piVar3;
      memcpy(pXStack_28->pOrder,*(void **)(*in_RSI + 0x48),(long)local_2c);
    }
    local_2c = *(int *)(*in_RSI + 0xc);
    if (local_2c != 0) {
      pXStack_28->nText = local_2c;
      ppcVar4 = (char **)malloc((long)local_2c << 3);
      pXStack_28->pText = ppcVar4;
      while (iVar7 = local_2c + -1, local_2c != 0) {
        local_2c = iVar7;
        pcVar1 = stringDup(*(char **)(*(long *)(*in_RSI + 0x30) + (long)iVar7 * 8),-1);
        pXStack_28->pText[local_2c] = pcVar1;
      }
    }
    local_2c = *(int *)(*in_RSI + 0x10);
    if (local_2c != 0) {
      pXStack_28->nClear = local_2c;
      pXVar5 = (XMLClear *)malloc((long)local_2c * 0x18);
      pXStack_28->pClear = pXVar5;
      while (iVar7 = local_2c + -1, local_2c != 0) {
        pXStack_28->pClear[iVar7].lpszCloseTag =
             *(char **)(*(long *)(*in_RSI + 0x38) + 0x10 + (long)iVar7 * 0x18);
        pXStack_28->pClear[iVar7].lpszOpenTag =
             *(char **)(*(long *)(*in_RSI + 0x38) + 8 + (long)iVar7 * 0x18);
        local_2c = iVar7;
        pcVar1 = stringDup(*(char **)(*(long *)(*in_RSI + 0x38) + (long)iVar7 * 0x18),-1);
        pXStack_28->pClear[local_2c].lpszValue = pcVar1;
      }
    }
    local_2c = *(int *)(*in_RSI + 8);
    if (local_2c != 0) {
      pXStack_28->nChild = local_2c;
      pXVar6 = (XMLNode *)malloc((long)local_2c << 3);
      pXStack_28->pChild = pXVar6;
      while (local_2c != 0) {
        pXStack_28->pChild[local_2c + -1].d = (XMLNodeData *)0x0;
        local_2c = local_2c + -1;
        deepCopy(local_48);
        operator=(pXStack_28->pChild + local_2c,local_48);
        ~XMLNode(local_48);
        (pXStack_28->pChild[local_2c].d)->pParent = pXStack_28;
      }
    }
  }
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::deepCopy() const
    {
        if(!d)
            return XMLNode::emptyXMLNode;
        XMLNode x(NULL, stringDup(d->lpszName), d->isDeclaration);
        XMLNodeData * p = x.d;
        int n = d->nAttribute;
        if(n)
        {
            p->nAttribute = n;
            p->pAttribute = (XMLAttribute *)malloc(n * sizeof(XMLAttribute));
            while(n--)
            {
                p->pAttribute[n].lpszName = stringDup(d->pAttribute[n].lpszName);
                p->pAttribute[n].lpszValue = stringDup(d->pAttribute[n].lpszValue);
            }
        }
        if(d->pOrder)
        {
            n = (d->nChild + d->nText + d->nClear) * sizeof(int);
            p->pOrder = (int *)malloc(n);
            memcpy(p->pOrder, d->pOrder, n);
        }
        n = d->nText;
        if(n)
        {
            p->nText = n;
            p->pText = (XMLCSTR *)malloc(n * sizeof(XMLCSTR));
            while(n--)
                p->pText[n] = stringDup(d->pText[n]);
        }
        n = d->nClear;
        if(n)
        {
            p->nClear = n;
            p->pClear = (XMLClear *)malloc(n * sizeof(XMLClear));
            while(n--)
            {
                p->pClear[n].lpszCloseTag = d->pClear[n].lpszCloseTag;
                p->pClear[n].lpszOpenTag = d->pClear[n].lpszOpenTag;
                p->pClear[n].lpszValue = stringDup(d->pClear[n].lpszValue);
            }
        }
        n = d->nChild;
        if(n)
        {
            p->nChild = n;
            p->pChild = (XMLNode *)malloc(n * sizeof(XMLNode));
            while(n--)
            {
                p->pChild[n].d = NULL;
                p->pChild[n] = d->pChild[n].deepCopy();
                p->pChild[n].d->pParent = p;
            }
        }
        return x;
    }